

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spritesheet.cpp
# Opt level: O0

void __thiscall Rml::SpritesheetList::Merge(SpritesheetList *this,SpritesheetList *other)

{
  bool bVar1;
  const_iterator __first;
  const_iterator __last;
  size_type sVar2;
  size_type sVar3;
  SpriteMap *this_00;
  reference key;
  type pSVar4;
  Sprite *sprite;
  String *sprite_name;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Sprite>
  *pair;
  const_iterator __end1;
  const_iterator __begin1;
  SpriteMap *__range1;
  __normal_iterator<std::shared_ptr<const_Rml::Spritesheet>_*,_std::vector<std::shared_ptr<const_Rml::Spritesheet>,_std::allocator<std::shared_ptr<const_Rml::Spritesheet>_>_>_>
  local_28;
  const_iterator local_20;
  SpritesheetList *local_18;
  SpritesheetList *other_local;
  SpritesheetList *this_local;
  
  local_18 = other;
  other_local = this;
  local_28._M_current =
       (shared_ptr<const_Rml::Spritesheet> *)
       ::std::
       vector<std::shared_ptr<const_Rml::Spritesheet>,_std::allocator<std::shared_ptr<const_Rml::Spritesheet>_>_>
       ::end(&this->spritesheets);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<Rml::Spritesheet_const>const*,std::vector<std::shared_ptr<Rml::Spritesheet_const>,std::allocator<std::shared_ptr<Rml::Spritesheet_const>>>>
  ::__normal_iterator<std::shared_ptr<Rml::Spritesheet_const>*>
            ((__normal_iterator<std::shared_ptr<Rml::Spritesheet_const>const*,std::vector<std::shared_ptr<Rml::Spritesheet_const>,std::allocator<std::shared_ptr<Rml::Spritesheet_const>>>>
              *)&local_20,&local_28);
  __first = ::std::
            vector<std::shared_ptr<const_Rml::Spritesheet>,_std::allocator<std::shared_ptr<const_Rml::Spritesheet>_>_>
            ::begin(&local_18->spritesheets);
  __last = ::std::
           vector<std::shared_ptr<const_Rml::Spritesheet>,_std::allocator<std::shared_ptr<const_Rml::Spritesheet>_>_>
           ::end(&local_18->spritesheets);
  ::std::
  vector<std::shared_ptr<Rml::Spritesheet_const>,std::allocator<std::shared_ptr<Rml::Spritesheet_const>>>
  ::
  insert<__gnu_cxx::__normal_iterator<std::shared_ptr<Rml::Spritesheet_const>const*,std::vector<std::shared_ptr<Rml::Spritesheet_const>,std::allocator<std::shared_ptr<Rml::Spritesheet_const>>>>,void>
            ((vector<std::shared_ptr<Rml::Spritesheet_const>,std::allocator<std::shared_ptr<Rml::Spritesheet_const>>>
              *)this,local_20,
             (__normal_iterator<const_std::shared_ptr<const_Rml::Spritesheet>_*,_std::vector<std::shared_ptr<const_Rml::Spritesheet>,_std::allocator<std::shared_ptr<const_Rml::Spritesheet>_>_>_>
              )__first._M_current,
             (__normal_iterator<const_std::shared_ptr<const_Rml::Spritesheet>_*,_std::vector<std::shared_ptr<const_Rml::Spritesheet>,_std::allocator<std::shared_ptr<const_Rml::Spritesheet>_>_>_>
              )__last._M_current);
  sVar2 = robin_hood::detail::
          Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Sprite,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->sprite_map);
  sVar3 = robin_hood::detail::
          Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Sprite,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&local_18->sprite_map);
  robin_hood::detail::
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Sprite,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&this->sprite_map,sVar2 + sVar3);
  this_00 = &local_18->sprite_map;
  join_0x00000010_0x00000000_ =
       robin_hood::detail::
       Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Sprite,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(this_00);
  _pair = robin_hood::detail::
          Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Sprite,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(this_00);
  while( true ) {
    bVar1 = robin_hood::detail::
            Table<true,80ul,std::__cxx11::string,Rml::Sprite,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
            ::Iter<true>::operator!=((Iter<true> *)&__end1.mInfo,(Iter<true> *)&pair);
    if (!bVar1) break;
    key = robin_hood::detail::
          Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Sprite,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::Iter<true>::operator*((Iter<true> *)&__end1.mInfo);
    pSVar4 = robin_hood::detail::
             Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Sprite,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]<Rml::Sprite>(&this->sprite_map,&key->first);
    (pSVar4->rectangle).p0 = (key->second).rectangle.p0;
    (pSVar4->rectangle).p1 = (key->second).rectangle.p1;
    pSVar4->sprite_sheet = (key->second).sprite_sheet;
    robin_hood::detail::
    Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Sprite,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::Iter<true>::operator++((Iter<true> *)&__end1.mInfo);
  }
  return;
}

Assistant:

void SpritesheetList::Merge(const SpritesheetList& other)
{
	spritesheets.insert(spritesheets.end(), other.spritesheets.begin(), other.spritesheets.end());
	sprite_map.reserve(sprite_map.size() + other.sprite_map.size());

	for (auto& pair : other.sprite_map)
	{
		const String& sprite_name = pair.first;
		const Sprite& sprite = pair.second;

		// Add the sprite into our map. If a sprite with the same name exists, it will be overwritten by the other sprite.
		sprite_map[sprite_name] = sprite;
	}
}